

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O0

void olsrv2_routing_domain_changed(nhdp_domain *domain,_Bool autoupdate_ansn)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  nhdp_domain *pnStack_10;
  _Bool autoupdate_ansn_local;
  nhdp_domain *domain_local;
  
  _update_ansn = _update_ansn || autoupdate_ansn;
  if (domain == (nhdp_domain *)0x0) {
    plVar2 = nhdp_domain_get_list();
    plVar2 = plVar2->next;
    while( true ) {
      pnStack_10 = (nhdp_domain *)(plVar2 + -0x2a);
      plVar1 = plVar2->prev;
      plVar3 = nhdp_domain_get_list();
      if (plVar1 == plVar3->prev) break;
      olsrv2_routing_domain_changed(pnStack_10,false);
      plVar2 = plVar2->next;
    }
  }
  else {
    _domain_changed[domain->index] = true;
    olsrv2_routing_trigger_update();
  }
  return;
}

Assistant:

void
olsrv2_routing_domain_changed(struct nhdp_domain *domain, bool autoupdate_ansn) {
  _update_ansn |= autoupdate_ansn;
  if (domain) {
    _domain_changed[domain->index] = true;

    olsrv2_routing_trigger_update();
    return;
  }

  list_for_each_element(nhdp_domain_get_list(), domain, _node) {
    olsrv2_routing_domain_changed(domain, false);
  }
}